

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::decompress
               (PixelBufferAccess *dst,deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  bool isSRGB;
  bool local_22;
  bool isSRGBFormat;
  AstcMode mode_local;
  CompressedTexFormat format_local;
  deUint8 *data_local;
  PixelBufferAccess *dst_local;
  
  isSRGB = isAstcSRGBFormat(format);
  local_22 = isSRGB || mode == ASTCMODE_LDR;
  anon_unknown_0::decompress(dst,data,isSRGB,local_22);
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const bool			isSRGBFormat	= isAstcSRGBFormat(format);

#if defined(DE_DEBUG)
	const tcu::IVec3	blockPixelSize	= getBlockPixelSize(format);

	DE_ASSERT(dst.getWidth()	== blockPixelSize.x() &&
			  dst.getHeight()	== blockPixelSize.y() &&
			  dst.getDepth()	== blockPixelSize.z());
	DE_ASSERT(mode == TexDecompressionParams::ASTCMODE_LDR || mode == TexDecompressionParams::ASTCMODE_HDR);
#endif

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGBFormat));

	decompress(dst, data, isSRGBFormat, isSRGBFormat || mode == TexDecompressionParams::ASTCMODE_LDR);
}